

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safeint.h
# Opt level: O2

SafeInt<unsigned_long> mp::operator+(SafeInt<unsigned_long> a,SafeInt<unsigned_long> b)

{
  undefined8 *puVar1;
  unsigned_long b_value;
  unsigned_long a_value;
  
  if (!CARRY8(a.value_,b.value_)) {
    return (SafeInt<unsigned_long>)(a.value_ + b.value_);
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = &PTR__exception_003a2398;
  __cxa_throw(puVar1,&OverflowError::typeinfo,std::exception::~exception);
}

Assistant:

inline SafeInt<T> operator+(SafeInt<T> a, SafeInt<T> b) {
  T a_value = val(a), b_value = val(b);
  if (!fmt::internal::is_negative(a_value)) {
    if (b_value > std::numeric_limits<T>::max() - a_value)
      throw OverflowError();
  } else if (b_value < std::numeric_limits<T>::min() - a_value)
    throw OverflowError();
  return a_value + b_value;
}